

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_data_exception(TCGContext_conflict12 *tcg_ctx,uint8_t dxc)

{
  TCGv_i32 arg2;
  TCGv_i32 tmp;
  uint8_t dxc_local;
  TCGContext_conflict12 *tcg_ctx_local;
  
  arg2 = tcg_const_i32_s390x(tcg_ctx,(uint)dxc);
  gen_helper_data_exception(tcg_ctx,tcg_ctx->cpu_env,arg2);
  tcg_temp_free_i32(tcg_ctx,arg2);
  return;
}

Assistant:

static inline void gen_data_exception(TCGContext *tcg_ctx, uint8_t dxc)
{
    TCGv_i32 tmp = tcg_const_i32(tcg_ctx, dxc);
    gen_helper_data_exception(tcg_ctx, tcg_ctx->cpu_env, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
}